

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exper.c
# Opt level: O0

void more_experienced(int exp,int score,int rexp)

{
  int iVar1;
  int rexp_local;
  int score_local;
  int exp_local;
  
  u.uexp = exp + u.uexp;
  u.urexp = exp * 4 + rexp + u.urexp;
  u.urscore = score * 4 + rexp + u.urscore;
  iflags.botl = '\x01';
  iVar1 = 2000;
  if (urole.malenum == 0x168) {
    iVar1 = 1000;
  }
  if (iVar1 <= u.urexp) {
    flags.beginner = '\0';
  }
  return;
}

Assistant:

void more_experienced(int exp, int score, int rexp)
{
	u.uexp += exp;
	u.urexp += 4*exp + rexp;
	u.urscore += 4*score + rexp;
	iflags.botl = 1;
	if (u.urexp >= (Role_if (PM_WIZARD) ? 1000 : 2000))
		flags.beginner = 0;
}